

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::MergeUsingImpl
          (Parser *this,ZeroCopyInputStream *param_1,Message *output,ParserImpl *parser_impl)

{
  pointer this_00;
  bool bVar1;
  char *in_R8;
  string_view separator;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  string local_108;
  AlphaNum local_e8;
  AlphaNum local_b8;
  string local_88;
  string_view local_68;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missing_fields;
  ParserImpl *parser_impl_local;
  Message *output_local;
  ZeroCopyInputStream *param_1_local;
  Parser *this_local;
  
  missing_fields.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)parser_impl;
  bVar1 = ParserImpl::Parse(parser_impl,output);
  if (bVar1) {
    if (((this->allow_partial_ & 1U) == 0) &&
       (bVar1 = MessageLite::IsInitialized(&output->super_MessageLite), !bVar1)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_48);
      Message::FindInitializationErrors
                (output,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_48);
      this_00 = missing_fields.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_b8,"Message missing required fields: ");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118,", ");
      separator._M_str = in_R8;
      separator._M_len = (size_t)local_118._M_str;
      absl::lts_20250127::
      StrJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_108,(lts_20250127 *)local_48,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_118._M_len,separator);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_e8,&local_108);
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_88,(lts_20250127 *)&local_b8,&local_e8,(AlphaNum *)local_118._M_str);
      local_68 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_88);
      ParserImpl::ReportError((ParserImpl *)this_00,-1,0,local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
      return false;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TextFormat::Parser::MergeUsingImpl(io::ZeroCopyInputStream* /* input */,
                                        Message* output,
                                        ParserImpl* parser_impl) {
  if (!parser_impl->Parse(output)) return false;
  if (!allow_partial_ && !output->IsInitialized()) {
    std::vector<std::string> missing_fields;
    output->FindInitializationErrors(&missing_fields);
    parser_impl->ReportError(-1, 0,
                             absl::StrCat("Message missing required fields: ",
                                          absl::StrJoin(missing_fields, ", ")));
    return false;
  }
  return true;
}